

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void wtree(wtree_object wt,double *inp)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *__dest;
  int iVar6;
  ulong in_RCX;
  long lVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  char *pcVar16;
  double dVar17;
  ulong local_40;
  
  local_40 = (ulong)wt->siglength;
  iVar8 = wt->J;
  uVar12 = (ulong)iVar8;
  wt->length[uVar12 + 1] = wt->siglength;
  wt->outlength = 0;
  wt->zpad = 0;
  __dest = (char *)malloc(local_40 << 3);
  if (0 < (long)wt->siglength) {
    memcpy(__dest,inp,(long)wt->siglength << 3);
  }
  iVar6 = wt->wave->lpd_len;
  iVar3 = strcmp(wt->ext,"per");
  if (iVar3 == 0) {
    if (0 < iVar8) {
      iVar6 = wt->outlength;
      iVar3 = 2;
      uVar11 = local_40;
      uVar13 = uVar12;
      do {
        dVar17 = ceil((double)(int)uVar11 * 0.5);
        uVar4 = (uint)dVar17;
        uVar11 = (ulong)uVar4;
        wt->length[uVar13] = uVar4;
        iVar6 = iVar6 + iVar3 * uVar4;
        in_RCX = uVar13 - 1;
        iVar3 = iVar3 * 2;
        bVar2 = 1 < (long)uVar13;
        uVar13 = in_RCX;
      } while (bVar2);
      wt->outlength = iVar6;
    }
    wt->length[0] = wt->length[1];
    if (0 < iVar8) {
      uVar4 = wt->outlength;
      uVar11 = 0;
      uVar5 = 1;
      do {
        iVar8 = *(int *)((long)wt + (uVar12 - uVar11) * 4 + 0x50);
        uVar4 = uVar4 - iVar8 * uVar5 * 2;
        if (0 < (int)uVar5) {
          pcVar14 = wt[1].method + (long)(int)in_RCX * 8 + -0x10;
          uVar13 = (ulong)uVar5;
          pcVar16 = wt[1].method + (long)(int)uVar4 * 8 + -0x10;
          do {
            pcVar9 = __dest;
            if (uVar11 != 0) {
              pcVar9 = pcVar14;
            }
            wtree_per(wt,(double *)pcVar9,(int)local_40,(double *)pcVar16,iVar8,
                      (double *)(pcVar16 + (long)iVar8 * 8));
            pcVar16 = pcVar16 + (long)(iVar8 * 2) * 8;
            pcVar14 = pcVar14 + (long)(int)local_40 * 8;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        local_40 = (ulong)*(uint *)((long)wt + (uVar12 - uVar11) * 4 + 0x50);
        uVar11 = uVar11 + 1;
        in_RCX = (ulong)uVar4;
        uVar5 = uVar5 * 2;
      } while (uVar11 != uVar12);
    }
  }
  else {
    iVar3 = strcmp(wt->ext,"sym");
    if (iVar3 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    if (0 < iVar8) {
      iVar3 = wt->outlength;
      iVar15 = 2;
      uVar11 = local_40;
      uVar13 = uVar12;
      do {
        dVar17 = ceil((double)((int)uVar11 + iVar6 + -2) * 0.5);
        uVar4 = (uint)dVar17;
        uVar11 = (ulong)uVar4;
        wt->length[uVar13] = uVar4;
        iVar3 = iVar3 + iVar15 * uVar4;
        in_RCX = uVar13 - 1;
        iVar15 = iVar15 * 2;
        bVar2 = 1 < (long)uVar13;
        uVar13 = in_RCX;
      } while (bVar2);
      wt->outlength = iVar3;
    }
    wt->length[0] = wt->length[1];
    if (0 < iVar8) {
      uVar4 = wt->outlength;
      uVar11 = 0;
      uVar5 = 1;
      do {
        iVar8 = *(int *)((long)wt + (uVar12 - uVar11) * 4 + 0x50);
        uVar4 = uVar4 - iVar8 * uVar5 * 2;
        if (0 < (int)uVar5) {
          pcVar14 = wt[1].method + (long)(int)in_RCX * 8 + -0x10;
          uVar13 = (ulong)uVar5;
          pcVar16 = wt[1].method + (long)(int)uVar4 * 8 + -0x10;
          do {
            pcVar9 = __dest;
            if (uVar11 != 0) {
              pcVar9 = pcVar14;
            }
            wtree_sym(wt,(double *)pcVar9,(int)local_40,(double *)pcVar16,iVar8,
                      (double *)(pcVar16 + (long)iVar8 * 8));
            pcVar16 = pcVar16 + (long)(iVar8 * 2) * 8;
            pcVar14 = pcVar14 + (long)(int)local_40 * 8;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        local_40 = (ulong)*(uint *)((long)wt + (uVar12 - uVar11) * 4 + 0x50);
        uVar11 = uVar11 + 1;
        in_RCX = (ulong)uVar4;
        uVar5 = uVar5 * 2;
      } while (uVar11 != uVar12);
    }
  }
  uVar4 = wt->J;
  uVar12 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    iVar6 = wt->outlength + wt->length[uVar12] * -2;
    piVar1 = wt->nodelength;
    iVar8 = 2;
    uVar11 = 0;
    iVar3 = 0;
    do {
      lVar7 = 0;
      iVar15 = iVar6;
      do {
        piVar1[iVar3 + lVar7] = iVar15;
        iVar15 = iVar15 + *(int *)((long)wt + (uVar12 - uVar11) * 4 + 0x50);
        lVar7 = lVar7 + 1;
      } while (iVar8 + (uint)(iVar8 == 0) != (int)lVar7);
      iVar3 = iVar3 + (int)lVar7;
      iVar8 = iVar8 * 2;
      iVar6 = iVar6 - wt->length[~uVar11 + uVar12] * iVar8;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12);
  }
  piVar1 = wt->coeflength;
  *piVar1 = wt->siglength;
  if (0 < (int)uVar4) {
    lVar7 = uVar12 + 1;
    lVar10 = 1;
    do {
      piVar1[lVar10] = wt->length[(int)uVar12];
      lVar10 = lVar10 + 1;
      uVar12 = (ulong)((int)uVar12 - 1);
    } while (lVar7 != lVar10);
  }
  free(__dest);
  return;
}

Assistant:

void wtree(wtree_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp,p2,k,N2,Np;
	int len_cA,t,t2,it1;
	double *orig;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
		wt->zpad = 0;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
		wt->zpad = 1;
		temp_len++;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	*/
	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;
        p2 = 1;

	if (!strcmp(wt->ext,"per")) {
		i = J;
                p2 = 2;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;
		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                               wtree_per(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_per(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
                p2 = 2;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;

                for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                                wtree_sym(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_sym(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	J = wt->J;
	t2 = wt->outlength - 2 * wt->length[J];
	p2 = 2;
	it1 = 0;
	for (i = 0; i < J; ++i) {
		t = t2;
		for (k = 0; k < p2; ++k) {
			wt->nodelength[it1] = t;
			it1++;
			t += wt->length[J - i];
		}
		p2 *= 2;
		t2 = t2 - p2 * wt->length[J - i - 1];
	}

	wt->coeflength[0] = wt->siglength;

	for (i = 1; i < J + 1; ++i) {
		wt->coeflength[i] = wt->length[J - i + 1];
	}

	free(orig);
}